

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O0

QByteArray * __thiscall QJsonDocument::toJson(QJsonDocument *this,JsonFormat format)

{
  long lVar1;
  bool bVar2;
  JsonFormat in_EDX;
  QCborValue *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray json;
  QByteArray *this_00;
  QCborValue *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  this_01 = in_RSI;
  QByteArray::QByteArray((QByteArray *)0x1afd48);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *
                     )0x1afd52);
  if (bVar2) {
    std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::operator->
              ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
               0x1afd78);
    QJsonPrivate::Value::fromTrustedCbor(in_RSI);
    QJsonValue::toJson((QJsonValue *)this_01,in_EDX);
    QJsonValue::~QJsonValue((QJsonValue *)0x1afdae);
  }
  else {
    QByteArray::QByteArray(this_00,in_RDI);
  }
  QByteArray::~QByteArray((QByteArray *)0x1afdc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QJsonDocument::toJson(JsonFormat format) const
{
    QByteArray json;
    if (!d)
        return json;

    return QJsonPrivate::Value::fromTrustedCbor(d->value).toJson(
            format == JsonFormat::Compact ? QJsonValue::JsonFormat::Compact
                                          : QJsonValue::JsonFormat::Indented);
}